

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O3

void mi_option_init(mi_option_desc_t *desc)

{
  mi_option_t mVar1;
  bool bVar2;
  _Bool _Var3;
  byte bVar4;
  size_t sVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  size_t sVar10;
  char *end;
  char buf [65];
  char s [65];
  byte *local_c0;
  byte local_b8 [80];
  char local_68 [80];
  
  _mi_strlcpy((char *)local_b8,"mimalloc_",0x41);
  _mi_strlcat((char *)local_b8,desc->name,0x41);
  _Var3 = _mi_getenv((char *)local_b8,local_68,0x41);
  if (!_Var3) {
    if (desc->legacy_name == (char *)0x0) {
LAB_002496ec:
      _Var3 = _mi_preloading();
      if (_Var3) {
        return;
      }
      desc->init = DEFAULTED;
      return;
    }
    _mi_strlcpy((char *)local_b8,"mimalloc_",0x41);
    _mi_strlcat((char *)local_b8,desc->legacy_name,0x41);
    _Var3 = _mi_getenv((char *)local_b8,local_68,0x41);
    if (!_Var3) goto LAB_002496ec;
    _mi_warning_message("environment option \"mimalloc_%s\" is deprecated -- use \"mimalloc_%s\" instead.\n"
                        ,desc->legacy_name,desc->name);
  }
  sVar5 = _mi_strnlen(local_68,0x40);
  if (sVar5 != 0) {
    sVar10 = 0;
    do {
      bVar4 = _mi_toupper(local_68[sVar10]);
      local_b8[sVar10] = bVar4;
      sVar10 = sVar10 + 1;
    } while (sVar5 != sVar10);
  }
  local_b8[sVar5] = 0;
  if ((local_b8[0] == 0) ||
     (pcVar6 = strstr("1;TRUE;YES;ON",(char *)local_b8), pcVar6 != (char *)0x0)) {
    desc->value = 1;
LAB_002496e3:
    desc->init = INITIALIZED;
    return;
  }
  pcVar6 = strstr("0;FALSE;NO;OFF",(char *)local_b8);
  if (pcVar6 != (char *)0x0) {
    desc->value = 0;
    goto LAB_002496e3;
  }
  local_c0 = local_b8;
  uVar7 = strtol((char *)local_b8,(char **)&local_c0,10);
  mVar1 = desc->option;
  uVar9 = (ulong)mVar1;
  if ((mVar1 != mi_option_reserve_os_memory) && (mVar1 != mi_option_arena_reserve))
  goto LAB_00249837;
  uVar8 = 0;
  if (0 < (long)uVar7) {
    uVar8 = uVar7;
  }
  bVar4 = *local_c0;
  if (bVar4 < 0x4d) {
    if (bVar4 == 0x47) {
      bVar2 = 0xfffffffffff < (long)uVar7;
      uVar8 = uVar8 << 0x14;
      goto LAB_002497f0;
    }
    if (bVar4 == 0x4b) {
      bVar2 = false;
      goto LAB_002497f0;
    }
LAB_002497af:
    uVar7 = uVar8 + 0x3ff >> 10;
    bVar2 = false;
  }
  else {
    if (bVar4 == 0x4d) {
      bVar2 = 0x3fffffffffffff < (long)uVar7;
      uVar8 = uVar8 << 10;
    }
    else {
      if (bVar4 != 0x54) goto LAB_002497af;
      bVar2 = 0x3ffffffff < (long)uVar7;
      uVar8 = uVar8 << 0x1e;
    }
LAB_002497f0:
    local_c0 = local_c0 + 1;
    bVar4 = *local_c0;
    uVar7 = uVar8;
  }
  if (bVar4 == 0x42) {
    local_c0 = local_c0 + 1;
  }
  else if ((bVar4 == 0x49) && (local_c0[1] == 0x42)) {
    local_c0 = local_c0 + 2;
  }
  if (0xfffffffe0000 < uVar7) {
    uVar7 = 0x3fffffff80;
  }
  if (bVar2) {
    uVar7 = 0x3fffffff80;
  }
LAB_00249837:
  if (*local_c0 == 0) {
    if (mi_option_generic_collect < mVar1) {
      return;
    }
    while( true ) {
      while( true ) {
        options[uVar9].value = uVar7;
        options[uVar9].init = INITIALIZED;
        if (options[uVar9].option != mi_option_guarded_max) break;
        uVar9 = 0x1e;
        if (options[0x1e].value <= (long)uVar7) {
          return;
        }
      }
      if (options[uVar9].option != mi_option_guarded_min) break;
      uVar9 = 0x1f;
      if ((long)uVar7 <= options[0x1f].value) {
        return;
      }
    }
    return;
  }
  desc->init = DEFAULTED;
  if ((mVar1 == mi_option_verbose) && (desc->value == 0)) {
    desc->value = 1;
    _mi_warning_message("environment option mimalloc_%s has an invalid value.\n",desc->name);
    desc->value = 0;
    return;
  }
  _mi_warning_message("environment option mimalloc_%s has an invalid value.\n",desc->name);
  return;
}

Assistant:

static void mi_option_init(mi_option_desc_t* desc) {
  // Read option value from the environment
  char s[64 + 1];
  char buf[64+1];
  _mi_strlcpy(buf, "mimalloc_", sizeof(buf));
  _mi_strlcat(buf, desc->name, sizeof(buf));
  bool found = _mi_getenv(buf, s, sizeof(s));
  if (!found && desc->legacy_name != NULL) {
    _mi_strlcpy(buf, "mimalloc_", sizeof(buf));
    _mi_strlcat(buf, desc->legacy_name, sizeof(buf));
    found = _mi_getenv(buf, s, sizeof(s));
    if (found) {
      _mi_warning_message("environment option \"mimalloc_%s\" is deprecated -- use \"mimalloc_%s\" instead.\n", desc->legacy_name, desc->name);
    }
  }

  if (found) {
    size_t len = _mi_strnlen(s, sizeof(buf) - 1);
    for (size_t i = 0; i < len; i++) {
      buf[i] = _mi_toupper(s[i]);
    }
    buf[len] = 0;
    if (buf[0] == 0 || strstr("1;TRUE;YES;ON", buf) != NULL) {
      desc->value = 1;
      desc->init = INITIALIZED;
    }
    else if (strstr("0;FALSE;NO;OFF", buf) != NULL) {
      desc->value = 0;
      desc->init = INITIALIZED;
    }
    else {
      char* end = buf;
      long value = strtol(buf, &end, 10);
      if (mi_option_has_size_in_kib(desc->option)) {
        // this option is interpreted in KiB to prevent overflow of `long` for large allocations
        // (long is 32-bit on 64-bit windows, which allows for 4TiB max.)
        size_t size = (value < 0 ? 0 : (size_t)value);
        bool overflow = false;
        if (*end == 'K') { end++; }
        else if (*end == 'M') { overflow = mi_mul_overflow(size,MI_KiB,&size); end++; }
        else if (*end == 'G') { overflow = mi_mul_overflow(size,MI_MiB,&size); end++; }
        else if (*end == 'T') { overflow = mi_mul_overflow(size,MI_GiB,&size); end++; }
        else { size = (size + MI_KiB - 1) / MI_KiB; }
        if (end[0] == 'I' && end[1] == 'B') { end += 2; } // KiB, MiB, GiB, TiB
        else if (*end == 'B') { end++; }                  // Kb, Mb, Gb, Tb
        if (overflow || size > MI_MAX_ALLOC_SIZE) { size = (MI_MAX_ALLOC_SIZE / MI_KiB); }
        value = (size > LONG_MAX ? LONG_MAX : (long)size);
      }
      if (*end == 0) {
        mi_option_set(desc->option, value);
      }
      else {
        // set `init` first to avoid recursion through _mi_warning_message on mimalloc_verbose.
        desc->init = DEFAULTED;
        if (desc->option == mi_option_verbose && desc->value == 0) {
          // if the 'mimalloc_verbose' env var has a bogus value we'd never know
          // (since the value defaults to 'off') so in that case briefly enable verbose
          desc->value = 1;
          _mi_warning_message("environment option mimalloc_%s has an invalid value.\n", desc->name);
          desc->value = 0;
        }
        else {
          _mi_warning_message("environment option mimalloc_%s has an invalid value.\n", desc->name);
        }
      }
    }
    mi_assert_internal(desc->init != UNINIT);
  }
  else if (!_mi_preloading()) {
    desc->init = DEFAULTED;
  }
}